

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O0

_Bool bson_iter_find_descendant(bson_iter_t *iter,char *dotkey,bson_iter_t *descendant)

{
  _Bool _Var1;
  bson_type_t bVar2;
  char *pcVar3;
  size_t sVar4;
  char *in_RDX;
  bson_iter_t *in_RSI;
  bson_iter_t *in_RDI;
  size_t sublen;
  char *dot;
  bson_iter_t tmp;
  int local_110;
  undefined8 in_stack_ffffffffffffff48;
  
  if (in_RDI == (bson_iter_t *)0x0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-iter.c"
            ,0x175,"bson_iter_find_descendant","iter");
    abort();
  }
  if (in_RSI == (bson_iter_t *)0x0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-iter.c"
            ,0x176,"bson_iter_find_descendant","dotkey");
    abort();
  }
  if (in_RDX == (char *)0x0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-iter.c"
            ,0x177,"bson_iter_find_descendant","descendant");
    abort();
  }
  pcVar3 = strchr((char *)in_RSI,0x2e);
  if (pcVar3 == (char *)0x0) {
    sVar4 = strlen((char *)in_RSI);
    local_110 = (int)sVar4;
  }
  else {
    local_110 = (int)pcVar3 - (int)in_RSI;
  }
  _Var1 = _bson_iter_find_with_len(in_RDI,(char *)in_RSI,local_110);
  if (_Var1) {
    if (pcVar3 == (char *)0x0) {
      memcpy(in_RDX,in_RDI,0x50);
      return true;
    }
    bVar2 = bson_iter_type(in_RDI);
    if (((bVar2 == BSON_TYPE_DOCUMENT) || (bVar2 = bson_iter_type(in_RDI), bVar2 == BSON_TYPE_ARRAY)
        ) && (_Var1 = bson_iter_recurse(in_RDI,(bson_iter_t *)&stack0xffffffffffffff00), _Var1)) {
      _Var1 = bson_iter_find_descendant(in_RSI,in_RDX,(bson_iter_t *)in_stack_ffffffffffffff48);
      return _Var1;
    }
  }
  return false;
}

Assistant:

bool
bson_iter_find_descendant (bson_iter_t *iter,       /* INOUT */
                           const char *dotkey,      /* IN */
                           bson_iter_t *descendant) /* OUT */
{
   bson_iter_t tmp;
   const char *dot;
   size_t sublen;

   BSON_ASSERT (iter);
   BSON_ASSERT (dotkey);
   BSON_ASSERT (descendant);

   if ((dot = strchr (dotkey, '.'))) {
      sublen = dot - dotkey;
   } else {
      sublen = strlen (dotkey);
   }

   if (_bson_iter_find_with_len (iter, dotkey, (int) sublen)) {
      if (!dot) {
         *descendant = *iter;
         return true;
      }

      if (BSON_ITER_HOLDS_DOCUMENT (iter) || BSON_ITER_HOLDS_ARRAY (iter)) {
         if (bson_iter_recurse (iter, &tmp)) {
            return bson_iter_find_descendant (&tmp, dot + 1, descendant);
         }
      }
   }

   return false;
}